

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decrypt.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  char cVar3;
  ostream *poVar4;
  size_t sVar5;
  int __oflag;
  int iVar6;
  ofstream FileOut;
  ifstreambuf FileIn;
  undefined1 local_1488 [248];
  ios_base local_1390 [264];
  undefined1 local_1288 [64];
  undefined1 local_1248 [4632];
  _Head_base<0UL,_sai::VirtualPage_*,_false> local_30;
  _Head_base<0UL,_sai::VirtualPage_*,_false> local_20;
  
  if (argc < 3) {
    puts(
        "Decrypt user-created .sai files:\n\tDecrypt.exe (filename) (output)\n\tWunkolo - Wunkolo@gmail.com"
        );
    iVar6 = 1;
  }
  else {
    sai::ifstreambuf::ifstreambuf
              ((ifstreambuf *)local_1288,(span<const_unsigned_int,_256UL>)0x103114);
    std::filesystem::__cxx11::path::path<char*,std::filesystem::__cxx11::path>
              ((path *)local_1488,argv + 1,auto_format);
    sai::ifstreambuf::open((ifstreambuf *)local_1288,local_1488,__oflag);
    std::filesystem::__cxx11::path::~path((path *)local_1488);
    bVar2 = sai::ifstreambuf::is_open((ifstreambuf *)local_1288);
    if (bVar2) {
      std::ofstream::ofstream(local_1488);
      std::ofstream::open(local_1488,(_Ios_Openmode)argv[2]);
      cVar3 = std::__basic_file<char>::is_open();
      if (cVar3 == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Error opening file for writing: ",0x20);
        pcVar1 = argv[2];
        if (pcVar1 == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x107130);
        }
        else {
          sVar5 = strlen(pcVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar1,sVar5);
        }
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
        std::ostream::put('0');
        iVar6 = 1;
        std::ostream::flush();
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"File decrypted in:",0x12);
        std::chrono::_V2::system_clock::now();
        std::ostream::operator<<((ostream *)local_1488,(streambuf *)local_1288);
        std::chrono::_V2::system_clock::now();
        poVar4 = std::ostream::_M_insert<long>((long)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"ns",2);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        iVar6 = 0;
        std::ostream::flush();
      }
      local_1488._0_8_ = _VTT;
      *(undefined8 *)(local_1488 + *(long *)(_VTT + -0x18)) = _memcpy;
      std::filebuf::~filebuf((filebuf *)(local_1488 + 8));
      std::ios_base::~ios_base(local_1390);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Error opening file for reading: ",0x20);
      pcVar1 = argv[1];
      if (pcVar1 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x107130);
      }
      else {
        sVar5 = strlen(pcVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar1,sVar5);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
      std::ostream::put('0');
      iVar6 = 1;
      std::ostream::flush();
    }
    local_1288._0_8_ = &PTR__ifstreambuf_00105d20;
    if ((__uniq_ptr_impl<sai::VirtualPage,_std::default_delete<sai::VirtualPage>_>)
        local_20._M_head_impl !=
        (__uniq_ptr_impl<sai::VirtualPage,_std::default_delete<sai::VirtualPage>_>)0x0) {
      operator_delete(local_20._M_head_impl,0x1000);
    }
    local_20._M_head_impl = (VirtualPage *)0x0;
    if ((tuple<sai::VirtualPage_*,_std::default_delete<sai::VirtualPage>_>)local_30._M_head_impl !=
        (_Head_base<0UL,_sai::VirtualPage_*,_false>)0x0) {
      operator_delete(local_30._M_head_impl,0x1000);
    }
    local_30._M_head_impl = (VirtualPage *)0x0;
    std::ifstream::~ifstream(local_1248);
    local_1288._0_8_ = std::ostream::flush;
    std::locale::~locale((locale *)(local_1288 + 0x38));
  }
  return iVar6;
}

Assistant:

int main(int argc, char* argv[])
{
	if( argc < 3 )
	{
		puts(Help);
		return EXIT_FAILURE;
	}

	sai::ifstreambuf FileIn;
	FileIn.open(argv[1]);

	if( !FileIn.is_open() )
	{
		std::cout << "Error opening file for reading: " << argv[1] << std::endl;
		return EXIT_FAILURE;
	}

	std::ofstream FileOut;
	FileOut.open(argv[2], std::ios::binary);

	if( !FileOut.is_open() )
	{
		std::cout << "Error opening file for writing: " << argv[2] << std::endl;
		return EXIT_FAILURE;
	}

	std::cout << "File decrypted in:" << Benchmark<std::chrono::nanoseconds>::Run([&]() -> void {
											 FileOut << &FileIn;
										 }).count()
			  << "ns" << std::endl;

	return EXIT_SUCCESS;
}